

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::TagBelief::Update(TagBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  long lVar1;
  State *in_RAX;
  long *plVar2;
  long *plVar3;
  int i_1;
  int i;
  ulong uVar4;
  State *local_38;
  
  local_38 = in_RAX;
  plVar2 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                             (this->tag_model_,this,action,obs);
  uVar4 = 0;
  while( true ) {
    lVar1 = *(long *)&this->field_0x40;
    if ((ulong)(*(long *)&this->field_0x48 - lVar1 >> 3) <= uVar4) break;
    (**(code **)(*(long *)this->tag_model_ + 0xf0))
              (this->tag_model_,*(undefined8 *)(lVar1 + uVar4 * 8));
    uVar4 = uVar4 + 1;
  }
  if (*(long *)&this->field_0x48 != lVar1) {
    *(long *)&this->field_0x48 = lVar1;
  }
  plVar3 = (long *)(**(code **)(*plVar2 + 0x30))(plVar2);
  uVar4 = 0;
  while( true ) {
    if ((ulong)(plVar3[1] - *plVar3 >> 3) <= uVar4) break;
    local_38 = (State *)(**(code **)(*(long *)this->tag_model_ + 0xe8))
                                  (this->tag_model_,*(undefined8 *)(*plVar3 + uVar4 * 8));
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&this->field_0x40,&local_38)
    ;
    uVar4 = uVar4 + 1;
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void TagBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	Belief* updated = tag_model_->Tau(this, action, obs);

	for (int i = 0; i < particles_.size(); i++)
		tag_model_->Free(particles_[i]);
	particles_.clear();

	const vector<State*>& new_particles =
		static_cast<ParticleBelief*>(updated)->particles();
	for (int i = 0; i < new_particles.size(); i++)
		particles_.push_back(tag_model_->Copy(new_particles[i]));

	delete updated;
}